

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateFieldDocComment
               (Printer *printer,FieldDescriptor *field,Options *options,int function_type)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  CppType CVar3;
  FieldOptions *this;
  undefined4 in_register_0000000c;
  char *pcVar4;
  Options *pOVar5;
  string_view value;
  string_view input;
  bool local_1a9;
  string_view local_178;
  string_view local_168;
  char *local_158;
  string local_150;
  string_view local_130;
  bool local_119;
  undefined1 auStack_118 [7];
  bool can_return_null;
  string local_108;
  string_view local_e8 [2];
  string local_c8;
  undefined1 local_a8 [16];
  string local_98;
  undefined1 local_78 [16];
  string local_68;
  string_view local_48;
  string_view local_38;
  int local_24;
  FieldDescriptor *pFStack_20;
  int function_type_local;
  Options *options_local;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  pcVar4 = (char *)CONCAT44(in_register_0000000c,function_type);
  local_24 = function_type;
  pFStack_20 = (FieldDescriptor *)options;
  options_local = (Options *)field;
  field_local = (FieldDescriptor *)printer;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"/**\n");
  protobuf::io::Printer::Print<>(printer,local_38);
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>
            ((Printer *)field_local,(FieldDescriptor *)options_local);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48," * Generated from protobuf field <code>^def^</code>\n");
  FieldDescriptor::DebugString_abi_cxx11_(&local_c8,(FieldDescriptor *)options_local);
  local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
  value._M_len = local_a8._8_8_;
  value._M_str = pcVar4;
  php::(anonymous_namespace)::FirstLineOf_abi_cxx11_(&local_98,local_a8._0_8_,value);
  local_78 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_98);
  input._M_len = local_78._8_8_;
  input._M_str = pcVar4;
  php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_(&local_68,local_78._0_8_,input);
  pOVar5 = (Options *)0x1f31348;
  protobuf::io::Printer::Print<char[4],std::__cxx11::string>
            ((Printer *)pFVar1,local_48,(char (*) [4])0x1f31348,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_c8);
  pFVar1 = field_local;
  if (local_24 == 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_e8," * @param ^php_type^ $var\n");
    php::(anonymous_namespace)::PhpSetterTypeName_abi_cxx11_
              (&local_108,(_anonymous_namespace_ *)options_local,pFStack_20,pOVar5);
    protobuf::io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)pFVar1,local_e8[0],(char (*) [9])"php_type",&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    pFVar1 = field_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_118," * @return $this\n")
    ;
    protobuf::io::Printer::Print<>((Printer *)pFVar1,_auStack_118);
  }
  else if (local_24 == 2) {
    bVar2 = FieldDescriptor::has_presence((FieldDescriptor *)options_local);
    pOVar5 = (Options *)CONCAT71((int7)((ulong)pOVar5 >> 8),bVar2);
    local_1a9 = false;
    if (bVar2) {
      CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)options_local);
      local_1a9 = CVar3 == CPPTYPE_MESSAGE;
    }
    pFVar1 = field_local;
    local_119 = local_1a9;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_130," * @return ^php_type^^maybe_null^\n");
    php::(anonymous_namespace)::PhpGetterTypeName_abi_cxx11_
              (&local_150,(_anonymous_namespace_ *)options_local,pFStack_20,pOVar5);
    local_158 = anon_var_dwarf_37cdd0 + 5;
    if ((local_119 & 1U) != 0) {
      local_158 = "|null";
    }
    protobuf::io::Printer::Print<char[9],std::__cxx11::string,char[11],char_const*>
              ((Printer *)pFVar1,local_130,(char (*) [9])"php_type",&local_150,
               (char (*) [11])"maybe_null",&local_158);
    std::__cxx11::string::~string((string *)&local_150);
  }
  this = FieldDescriptor::options((FieldDescriptor *)options_local);
  bVar2 = FieldOptions::deprecated(this);
  pFVar1 = field_local;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_168," * @deprecated\n");
    protobuf::io::Printer::Print<>((Printer *)pFVar1,local_168);
  }
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_178," */\n");
  protobuf::io::Printer::Print<>((Printer *)pFVar1,local_178);
  return;
}

Assistant:

void GenerateFieldDocComment(io::Printer* printer, const FieldDescriptor* field,
                             const Options& options, int function_type) {
  // In theory we should have slightly different comments for setters, getters,
  // etc., but in practice everyone already knows the difference between these
  // so it's redundant information.

  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then end with the field declaration, e.g.:
  //   optional string foo = 5;
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, field);
  printer->Print(" * Generated from protobuf field <code>^def^</code>\n", "def",
                 EscapePhpdoc(FirstLineOf(field->DebugString())));
  if (function_type == kFieldSetter) {
    printer->Print(" * @param ^php_type^ $var\n", "php_type",
                   PhpSetterTypeName(field, options));
    printer->Print(" * @return $this\n");
  } else if (function_type == kFieldGetter) {
    bool can_return_null =
        field->has_presence() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE;
    printer->Print(" * @return ^php_type^^maybe_null^\n", "php_type",
                   PhpGetterTypeName(field, options), "maybe_null",
                   can_return_null ? "|null" : "");
  }
  if (field->options().deprecated()) {
    printer->Print(" * @deprecated\n");
  }
  printer->Print(" */\n");
}